

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O1

KHashMap * KHashMap_Init(KonohaContext *kctx,size_t init)

{
  KHashMap *kmap;
  KHashMapEntry *pKVar1;
  KHashMapEntry **ppKVar2;
  ulong uVar3;
  size_t sVar4;
  
  kmap = (KHashMap *)(*(kctx->platApi->GCModule).Kzmalloc)(kctx,0x30,(KTraceInfo *)0x0);
  sVar4 = 0x53;
  if (0x53 < init) {
    sVar4 = init;
  }
  uVar3 = sVar4 * 3 >> 2;
  kmap->arenasize = uVar3;
  pKVar1 = (KHashMapEntry *)(*(kctx->platApi->GCModule).Kmalloc)(kctx,uVar3 << 5,(KTraceInfo *)0x0);
  kmap->arena = pKVar1;
  KHashMap_MakeFreeList(kmap,0,kmap->arenasize);
  ppKVar2 = (KHashMapEntry **)
            (*(kctx->platApi->GCModule).Kzmalloc)(kctx,sVar4 * 8,(KTraceInfo *)0x0);
  kmap->hentry = ppKVar2;
  kmap->hmax = sVar4;
  kmap->size = 0;
  return kmap;
}

Assistant:

KLIBDECL KHashMap *KHashMap_Init(KonohaContext *kctx, size_t init)
{
	KHashMap *kmap = (KHashMap *)KCalloc_UNTRACE(sizeof(KHashMap), 1);
	if(init < HMAP_INIT) init = HMAP_INIT;
	kmap->arenasize = (init * 3) / 4;
	kmap->arena = (KHashMapEntry *)KMalloc_UNTRACE(kmap->arenasize * sizeof(KHashMapEntry));
	KHashMap_MakeFreeList(kmap, 0, kmap->arenasize);
	kmap->hentry = (KHashMapEntry**)KCalloc_UNTRACE(init, sizeof(KHashMapEntry *));
	kmap->hmax = init;
	kmap->size = 0;
	return (KHashMap *)kmap;
}